

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void __thiscall DriverTest_Glob_Test::DriverTest_Glob_Test(DriverTest_Glob_Test *this)

{
  DriverTest::DriverTest(&this->super_DriverTest);
  (this->super_DriverTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00174c80;
  (this->super_DriverTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__DriverTest_Glob_Test_00174cc0;
  return;
}

Assistant:

TEST_P(DriverTest, Glob)
{
    using Paths = std::set<std::string>;
    Arbiter a;

    const std::string rawRoot(GetParam());

    // Local directories explicitly prefixed with file:// will be returned
    // without that prefix, so strip that off.
    const std::string root(
            a.isLocal(rawRoot) ? stripProtocol(rawRoot) : rawRoot);
    const std::string type(getProtocol(root));

    // No `ls` for plain HTTP/s.
    if (type == "http" || type == "https") return;

    auto put([&a, root](std::string p)
    {
        EXPECT_NO_THROW(a.put(root + p, p));
    });

    if (a.isLocal(root))
    {
        mkdirp(root + "a");
        mkdirp(root + "a/b");
    }

    put("one.txt");
    put("two.txt");
    put("a/one.txt");
    put("a/two.txt");
    put("a/b/one.txt");
    put("a/b/two.txt");

    auto resolve([&a, root](std::string p)
    {
        const auto v = a.resolve(root + p);
        return Paths(v.begin(), v.end());
    });

    auto check([&](std::string p, Paths exp)
    {
        const auto got(resolve(p));
        EXPECT_GE(got.size(), exp.size());

        for (const auto& s : exp)
        {
            EXPECT_TRUE(got.count(root + s)) << p << ": " << root << s;
        }
    });

    // Non-recursive.
    check("*", Paths { "one.txt", "two.txt" });
    check("a/*", Paths { "a/one.txt", "a/two.txt" });
    check("a/b/*", Paths { "a/b/one.txt", "a/b/two.txt" });

    // Recursive.
    check("**", Paths {
            "one.txt", "two.txt",
            "a/one.txt", "a/two.txt",
            "a/b/one.txt", "a/b/two.txt"
        }
    );

    check("a/**", Paths {
            "a/one.txt", "a/two.txt",
            "a/b/one.txt", "a/b/two.txt"
        }
    );

    check("a/b/**", Paths { "a/b/one.txt", "a/b/two.txt" });

    // Not globs - files resolve to themselves.
    check("", Paths { "" });
    check("asdf", Paths { "asdf" });
    check("asdf.txt", Paths { "asdf.txt" });
}